

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

bool __thiscall
AlternativeLoader::altValidateContinentLine
          (AlternativeLoader *this,int *continentCount,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,bool verbose)

{
  ostream *poVar1;
  ulong uVar2;
  
  *continentCount = *continentCount + 1;
  uVar2 = (long)(lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < 0x21) {
    if (verbose) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*lineCount);
      std::operator<<(poVar1,
                      " - [ERROR] : a line in the continents declaration had missing tokens, map could not be created.\n"
                     );
    }
    *validMap = false;
  }
  else if (verbose && uVar2 != 0x40) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*lineCount);
    std::operator<<(poVar1,
                    " - [WARNING] : a line in  the continents declaration had extra tokens.\n");
  }
  return 0x20 < uVar2;
}

Assistant:

bool AlternativeLoader::altValidateContinentLine(int *continentCount, std::vector<std::string> *lineWords, const int *lineCount,
                                            bool *validMap,bool verbose) {
    (*continentCount)++;
    //check validity of the line in this mode
    if (lineWords->size() < 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the continents declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else if (lineWords->size() > 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [WARNING] : a line in  the continents declaration had extra tokens.\n";
        }
        return true;
    } else {
        return true;
    }
}